

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O2

bool __thiscall
HighsCutGeneration::preprocessBaseInequality
          (HighsCutGeneration *this,bool *hasUnboundedInts,bool *hasGeneralInts,bool *hasContinuous)

{
  double dVar1;
  pointer pdVar2;
  pointer puVar3;
  long lVar4;
  pointer __first;
  pointer piVar5;
  bool bVar6;
  ulong uVar7;
  double *pdVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var13;
  int iVar14;
  HighsInt i;
  long lVar15;
  double dVar16;
  HighsInt numCancel;
  vector<int,_std::allocator<int>_> cancelNzs;
  int expshift;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCutGeneration_cpp:974:42)>
  local_90;
  double local_88;
  ulong uStack_80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  HighsCDouble *local_70;
  _Vector_base<int,_std::allocator<int>_> local_68;
  ulong local_48;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCutGeneration_cpp:974:42)>
  local_40;
  int local_34;
  
  uVar7 = 0;
  *hasUnboundedInts = false;
  *hasContinuous = false;
  *hasGeneralInts = false;
  local_88 = this->feastol;
  uStack_80 = 0;
  uVar12 = (ulong)(uint)this->rowlen;
  if (this->rowlen < 1) {
    uVar12 = uVar7;
  }
  dVar16 = 0.0;
  for (; uVar12 != uVar7; uVar7 = uVar7 + 1) {
    if (dVar16 <= ABS(this->vals[uVar7])) {
      dVar16 = ABS(this->vals[uVar7]);
    }
  }
  local_34 = 0;
  frexp(dVar16,&local_34);
  iVar14 = -local_34;
  local_34 = iVar14;
  dVar16 = ldexp(1.0,iVar14);
  this->initialScale = dVar16;
  local_70 = &this->rhs;
  HighsCDouble::operator*=(local_70,dVar16);
  for (lVar15 = 0; lVar15 < this->rowlen; lVar15 = lVar15 + 1) {
    dVar16 = ldexp(this->vals[lVar15],iVar14);
    this->vals[lVar15] = dVar16;
  }
  local_88 = -local_88;
  uStack_80 = uStack_80 ^ 0x8000000000000000;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->isintegral,(long)this->rowlen);
  local_78._M_current = (int *)&this->complementation;
  uVar12 = 0;
  iVar14 = 0;
  do {
    uVar7 = (ulong)(uint)this->rowlen;
    if (uVar12 == uVar7) {
      iVar9 = (int)((double)(this->lpRelaxation->lpsolver).model_.lp_.num_col_ * 0.15 + 100.0);
      iVar10 = this->rowlen - iVar14;
      uVar11 = iVar10 - iVar9;
      if (uVar11 != 0 && iVar9 <= iVar10) {
        local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_68._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
        local_68._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
        iVar9 = 0;
        while( true ) {
          piVar5 = local_68._M_impl.super__Vector_impl_data._M_finish;
          __first = local_68._M_impl.super__Vector_impl_data._M_start;
          local_90._M_comp.this._0_4_ = iVar9;
          if (iVar9 == (int)uVar7) break;
          if (this->vals[iVar9] <= 0.0) {
            dVar16 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar9] -
                     (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar9];
          }
          else {
            dVar16 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar9];
          }
          if (dVar16 <= this->feastol) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&local_68,
                       (value_type_conflict2 *)&local_90);
            uVar7 = (ulong)(uint)this->rowlen;
            iVar9 = (int)local_90._M_comp.this;
          }
          iVar9 = iVar9 + 1;
        }
        local_48 = (ulong)((long)local_68._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_68._M_impl.super__Vector_impl_data._M_start) >> 2;
        if ((int)uVar11 <= (int)local_48) {
          if ((int)uVar11 < (int)local_48) {
            lVar15 = (long)(int)uVar11;
            local_90._M_comp.this = (anon_class_8_1_8991fb9c)(anon_class_8_1_8991fb9c)this;
            local_40._M_comp.this = (anon_class_8_1_8991fb9c)(anon_class_8_1_8991fb9c)this;
            if (1 < (int)uVar11) {
              uVar12 = lVar15 - 2U >> 1;
              do {
                std::
                __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::preprocessBaseInequality(bool&,bool&,bool&)::__0>>
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           __first,uVar12,lVar15,__first[uVar12],
                           (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCutGeneration_cpp:974:42)>
                            )this);
                bVar6 = uVar12 != 0;
                uVar12 = uVar12 - 1;
              } while (bVar6);
            }
            _Var13._M_current = __first + lVar15;
            local_78._M_current = _Var13._M_current;
            for (; _Var13._M_current < piVar5; _Var13._M_current = _Var13._M_current + 1) {
              if (ABS(this->vals[*_Var13._M_current]) < ABS(this->vals[*__first])) {
                std::
                __pop_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::preprocessBaseInequality(bool&,bool&,bool&)::__0>>
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           __first,local_78,_Var13,&local_90);
              }
            }
            _Var13._M_current = __first + lVar15;
            for (lVar15 = lVar15 << 2; _Var13._M_current = _Var13._M_current + -1, 4 < lVar15;
                lVar15 = lVar15 + -4) {
              std::
              __pop_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::preprocessBaseInequality(bool&,bool&,bool&)::__0>>
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first,
                         _Var13,_Var13,&local_40);
            }
          }
          uVar7 = 0;
          uVar12 = 0;
          if (0 < (int)uVar11) {
            uVar12 = (ulong)uVar11;
          }
          for (; uVar12 != uVar7; uVar7 = uVar7 + 1) {
            iVar9 = local_68._M_impl.super__Vector_impl_data._M_start[uVar7];
            pdVar8 = this->vals;
            dVar16 = pdVar8[iVar9] *
                     (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar9];
            if (0.0 <= pdVar8[iVar9]) {
              local_88 = local_88 - dVar16;
            }
            else {
              HighsCDouble::operator-=(local_70,dVar16);
              pdVar8 = this->vals;
            }
            pdVar8[iVar9] = 0.0;
          }
          iVar14 = iVar14 + uVar11;
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
        if ((int)local_48 < (int)uVar11) {
          return false;
        }
      }
      if (iVar14 != 0) {
        uVar12 = (ulong)(uint)this->rowlen;
        if ((this->complementation).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (this->complementation).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            pdVar8 = this->vals;
            lVar15 = 0;
            do {
              if ((int)uVar12 + (int)lVar15 < 1) goto LAB_002934cb;
              lVar4 = lVar15 + -1;
              lVar15 = lVar15 + -1;
            } while ((pdVar8[uVar12 + lVar4] != 0.0) || (NAN(pdVar8[uVar12 + lVar4])));
            iVar9 = this->rowlen;
            this->rowlen = iVar9 + -1;
            this->inds[uVar12 + lVar15] = this->inds[(long)iVar9 + -1];
            iVar9 = this->rowlen;
            pdVar8[uVar12 + lVar15] = pdVar8[iVar9];
            pdVar2 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar2[uVar12 + lVar15] = pdVar2[iVar9];
            pdVar2 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar2[uVar12 + lVar15] = pdVar2[iVar9];
            puVar3 = (this->isintegral).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar12 = uVar12 + lVar15;
            puVar3[uVar12] = puVar3[iVar9];
            iVar14 = iVar14 + -1;
          } while (iVar14 != 0);
        }
        else {
          do {
            pdVar8 = this->vals;
            lVar15 = 0;
            do {
              if ((int)uVar12 + (int)lVar15 < 1) goto LAB_002934cb;
              lVar4 = lVar15 + -1;
              lVar15 = lVar15 + -1;
            } while ((pdVar8[uVar12 + lVar4] != 0.0) || (NAN(pdVar8[uVar12 + lVar4])));
            iVar9 = this->rowlen;
            this->rowlen = iVar9 + -1;
            this->inds[uVar12 + lVar15] = this->inds[(long)iVar9 + -1];
            iVar9 = this->rowlen;
            pdVar8[uVar12 + lVar15] = pdVar8[iVar9];
            pdVar2 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar2[uVar12 + lVar15] = pdVar2[iVar9];
            pdVar2 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar2[uVar12 + lVar15] = pdVar2[iVar9];
            puVar3 = (this->isintegral).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar12 = uVar12 + lVar15;
            puVar3[uVar12] = puVar3[iVar9];
            puVar3 = (this->complementation).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar3[uVar12] = puVar3[this->rowlen];
            iVar14 = iVar14 + -1;
          } while (iVar14 != 0);
        }
      }
LAB_002934cb:
      return (this->rhs).hi + (this->rhs).lo < local_88;
    }
    bVar6 = HighsLpRelaxation::isColIntegral(this->lpRelaxation,this->inds[uVar12]);
    if (bVar6) {
      bVar6 = this->feastol * 10.0 < ABS(this->vals[uVar12]);
    }
    else {
      bVar6 = false;
    }
    (this->isintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[uVar12] = bVar6;
    dVar16 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12];
    if ((this->isintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start[uVar12] == '\0') {
      dVar1 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12];
      if (dVar16 < dVar1 + dVar1) {
        if ((this->complementation).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (this->complementation).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78._M_current,
                     (long)this->rowlen);
        }
        flipComplementation(this,(HighsInt)uVar12);
      }
      pdVar8 = this->vals;
      dVar16 = pdVar8[uVar12];
      if ((0.0 < dVar16) ||
         (ABS(dVar16) *
          (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12] <= this->feastol * 10.0)) {
        if (dVar16 < 0.0) {
          dVar1 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar12];
          if (INFINITY <= dVar1) {
            return false;
          }
          HighsCDouble::operator-=(local_70,dVar16 * dVar1);
          pdVar8 = this->vals;
        }
        iVar14 = iVar14 + 1;
        pdVar8[uVar12] = 0.0;
      }
      else {
        *hasContinuous = true;
      }
    }
    else {
      if (dVar16 < INFINITY) {
        if ((dVar16 != 1.0) || (NAN(dVar16))) goto LAB_002930e0;
      }
      else {
        *hasUnboundedInts = true;
LAB_002930e0:
        *hasGeneralInts = true;
      }
      if (0.0 < this->vals[uVar12]) {
        local_88 = local_88 + this->vals[uVar12] * dVar16;
      }
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

bool HighsCutGeneration::preprocessBaseInequality(bool& hasUnboundedInts,
                                                  bool& hasGeneralInts,
                                                  bool& hasContinuous) {
  // preprocess the inequality before cut generation
  // 1. Determine the maximal activity to check for trivial redundancy and
  // tighten coefficients
  // 2. Check for presence of continuous variables and unbounded integers as not
  // all methods for cut generation are applicable in that case
  // 3. Remove coefficients that are below the feasibility tolerance to avoid
  // numerical troubles, use bound constraints to cancel them and
  // reject base inequalities where that is not possible due to unbounded
  // variables
  hasUnboundedInts = false;
  hasContinuous = false;
  hasGeneralInts = false;
  HighsInt numZeros = 0;

  double maxact = -feastol;
  double maxAbsVal = 0;
  for (HighsInt i = 0; i < rowlen; ++i)
    maxAbsVal = std::max(std::abs(vals[i]), maxAbsVal);

  int expshift = 0;
  std::frexp(maxAbsVal, &expshift);
  expshift = -expshift;
  initialScale = std::ldexp(1.0, expshift);
  rhs *= initialScale;
  for (HighsInt i = 0; i < rowlen; ++i) vals[i] = std::ldexp(vals[i], expshift);

  isintegral.resize(rowlen);
  for (HighsInt i = 0; i != rowlen; ++i) {
    // we do not want to have integral variables with small coefficients as this
    // may lead to numerical instabilities during cut generation
    // Therefore we relax integral variables with small coefficients to
    // continuous ones because they still might have a non-negligible
    // contribution e.g. when they come from integral rows with coefficients on
    // the larger side. When we relax them to continuous variables they will be
    // complemented so that their solution value is closest to zero and then
    // will be relaxed if their value is positive or their maximal contribution
    // is below feasibility tolerance.
    isintegral[i] =
        lpRelaxation.isColIntegral(inds[i]) && std::abs(vals[i]) > 10 * feastol;

    if (!isintegral[i]) {
      // complement non-integer variable (cmir separation heuristic complements
      // integral variables in the same way)
      if (upper[i] < 2 * solval[i]) {
        if (complementation.empty()) complementation.resize(rowlen);

        flipComplementation(i);
      }

      // relax positive continuous variables and those with small contributions
      if (vals[i] > 0 || std::abs(vals[i]) * upper[i] <= 10 * feastol) {
        // printf("remove: vals[i] = %g  upper[i] = %g\n", vals[i], upper[i]);
        if (vals[i] < 0) {
          if (upper[i] == kHighsInf) return false;
          rhs -= vals[i] * upper[i];
        }

        ++numZeros;
        vals[i] = 0.0;
        continue;
      }

      hasContinuous = true;
      // if (lpRelaxation.isColIntegral(inds[i]))
      //   printf("vals[i] = %g  upper[i] = %g\n", vals[i], upper[i]);

      if (vals[i] > 0) {
        if (upper[i] == kHighsInf)
          maxact = kHighsInf;
        else
          maxact += vals[i] * upper[i];
      }
    } else {
      if (upper[i] == kHighsInf) {
        hasUnboundedInts = true;
        hasGeneralInts = true;
      } else if (upper[i] != 1.0) {
        hasGeneralInts = true;
      }

      if (vals[i] > 0) maxact += vals[i] * upper[i];
    }
  }

  HighsInt maxLen = 100 + 0.15 * (lpRelaxation.numCols());

  if (rowlen - numZeros > maxLen) {
    HighsInt numCancel = rowlen - numZeros - maxLen;
    std::vector<HighsInt> cancelNzs;

    for (HighsInt i = 0; i != rowlen; ++i) {
      double cancelSlack = vals[i] > 0 ? solval[i] : upper[i] - solval[i];
      if (cancelSlack <= feastol) cancelNzs.push_back(i);
    }

    if ((HighsInt)cancelNzs.size() < numCancel) return false;
    if ((HighsInt)cancelNzs.size() > numCancel)
      std::partial_sort(cancelNzs.begin(), cancelNzs.begin() + numCancel,
                        cancelNzs.end(), [&](HighsInt a, HighsInt b) {
                          return std::abs(vals[a]) < std::abs(vals[b]);
                        });

    for (HighsInt i = 0; i < numCancel; ++i) {
      HighsInt j = cancelNzs[i];

      if (vals[j] < 0) {
        rhs -= vals[j] * upper[j];
      } else
        maxact -= vals[j] * upper[j];

      vals[j] = 0.0;
    }

    numZeros += numCancel;
  }

  if (numZeros != 0) {
    // remove zeros in place
    if (complementation.empty()) {
      for (HighsInt i = rowlen - 1; i >= 0; --i) {
        if (vals[i] == 0.0) {
          --rowlen;
          inds[i] = inds[rowlen];
          vals[i] = vals[rowlen];
          upper[i] = upper[rowlen];
          solval[i] = solval[rowlen];
          isintegral[i] = isintegral[rowlen];
          if (--numZeros == 0) break;
        }
      }
    } else {
      for (HighsInt i = rowlen - 1; i >= 0; --i) {
        if (vals[i] == 0.0) {
          --rowlen;
          inds[i] = inds[rowlen];
          vals[i] = vals[rowlen];
          upper[i] = upper[rowlen];
          solval[i] = solval[rowlen];
          isintegral[i] = isintegral[rowlen];
          complementation[i] = complementation[rowlen];
          if (--numZeros == 0) break;
        }
      }
    }
  }

  return maxact > rhs;
}